

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O2

int getpart(char **outbuf,size_t *outlen,char *main,char *sub,FILE *stream)

{
  ushort *puVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  char *pcVar5;
  byte *src_buf;
  size_t sVar6;
  byte *pbVar7;
  ushort **ppuVar8;
  size_t sVar9;
  byte *__src;
  byte *pbVar10;
  ulong uVar11;
  bool bVar12;
  int local_210;
  int local_208;
  int local_204;
  size_t outalloc;
  char *local_1d8;
  char *local_1d0;
  char ptag [80];
  char csub [80];
  char cmain [80];
  char patt [80];
  char couter [80];
  
  outalloc = 0x100;
  *outlen = 0;
  pcVar5 = (char *)(*Curl_cmalloc)(0x100);
  *outbuf = pcVar5;
  if (pcVar5 == (char *)0x0) {
    return -1;
  }
  src_buf = (byte *)0x0;
  *pcVar5 = '\0';
  patt[0] = '\0';
  ptag[0] = '\0';
  csub[0] = '\0';
  cmain[0] = '\0';
  couter[0] = '\0';
  bVar2 = true;
  local_208 = -1;
  sVar9 = 0;
  local_204 = 0;
  local_210 = 0;
  local_1d8 = sub;
  local_1d0 = main;
LAB_00103ca3:
  if (src_buf == (byte *)0x0) {
    sVar9 = 0x80;
    src_buf = (byte *)(*Curl_cmalloc)(0x80);
    if (src_buf == (byte *)0x0) {
      src_buf = (byte *)0x0;
LAB_001040e5:
      bVar2 = false;
LAB_001040e7:
      (*Curl_cfree)(src_buf);
      if (!bVar2) {
        (*Curl_cfree)(*outbuf);
        *outbuf = (char *)0x0;
        *outlen = 0;
        return local_208;
      }
      return 0;
    }
  }
  uVar11 = 0;
  pbVar7 = src_buf;
  do {
    src_buf = pbVar7;
    do {
      iVar4 = curlx_uztosi(sVar9 - uVar11);
      pcVar5 = fgets((char *)(src_buf + uVar11),iVar4,(FILE *)stream);
      if (pcVar5 == (char *)0x0) {
        if (uVar11 == 0) {
          bVar2 = true;
          local_208 = 1;
          goto LAB_001040e7;
        }
LAB_00103d2c:
        pbVar7 = src_buf + 2;
        pbVar10 = src_buf;
        goto LAB_00103d3c;
      }
      sVar6 = strlen((char *)(src_buf + uVar11));
      uVar11 = uVar11 + sVar6;
      if (src_buf[uVar11 - 1] == 10) goto LAB_00103d2c;
    } while (uVar11 < sVar9 - 1);
    sVar9 = sVar9 * 2;
    pbVar7 = (byte *)(*Curl_crealloc)(src_buf,sVar9);
  } while (pbVar7 != (byte *)0x0);
  goto LAB_001040e5;
LAB_00103d3c:
  __src = pbVar10 + 1;
  bVar3 = *pbVar10;
  if ((ulong)bVar3 == 0) goto joined_r0x00103d76;
  ppuVar8 = __ctype_b_loc();
  puVar1 = *ppuVar8;
  if ((*(byte *)((long)puVar1 + (ulong)bVar3 * 2 + 1) & 0x20) != 0) goto code_r0x00103d56;
  if (bVar3 != 0x3c) goto joined_r0x00103d76;
  bVar3 = *__src;
  if (bVar3 != 0x2f) {
    if (!bVar2) goto LAB_00103d7c;
    sVar6 = 0;
    pbVar10 = __src;
    while (((bVar3 != 0 && (bVar3 != 0x3e)) && ((puVar1[bVar3] & 0x2000) == 0))) {
      bVar3 = pbVar10[1];
      pbVar10 = pbVar10 + 1;
      sVar6 = sVar6 + 1;
      pbVar7 = pbVar7 + 1;
    }
    if ((long)sVar6 < 0x50) {
      memcpy(ptag,__src,sVar6);
      ptag[sVar6] = '\0';
      if ((ptag[0] == '!') || (ptag[0] == '?')) {
        bVar2 = true;
        goto LAB_00103ca3;
      }
      while ((uVar11 = (ulong)*pbVar10, uVar11 != 0 &&
             ((*(byte *)((long)puVar1 + uVar11 * 2 + 1) & 0x20) != 0))) {
        pbVar10 = pbVar10 + 1;
        pbVar7 = pbVar7 + 1;
      }
      sVar6 = 0;
      while (((char)uVar11 != '\0' && ((int)uVar11 != 0x3e))) {
        bVar3 = *pbVar7;
        sVar6 = sVar6 + 1;
        pbVar7 = pbVar7 + 1;
        uVar11 = (ulong)bVar3;
      }
      if ((long)sVar6 < 0x50) {
        memcpy(patt,pbVar10,sVar6);
        patt[sVar6] = '\0';
        if (local_210 == 0) {
          pcVar5 = couter;
          local_210 = 1;
        }
        else {
          if (local_210 == 2) {
            strcpy(csub,ptag);
            iVar4 = strcmp(cmain,local_1d0);
            bVar2 = true;
            local_210 = 3;
            if (iVar4 == 0) {
              iVar4 = strcmp(csub,local_1d8);
              local_210 = 3;
              if (iVar4 == 0) {
                pcVar5 = strstr(patt,"base64=");
                if (pcVar5 != (char *)0x0) {
                  local_204 = 1;
                }
                bVar2 = false;
                local_210 = 3;
              }
            }
            goto LAB_00103ca3;
          }
          bVar12 = local_210 != 1;
          local_210 = 3;
          if (bVar12) goto joined_r0x00103d76;
          pcVar5 = cmain;
          local_210 = 2;
        }
        strcpy(pcVar5,ptag);
        bVar2 = true;
        goto LAB_00103ca3;
      }
    }
LAB_00104117:
    bVar2 = false;
    local_208 = -2;
    goto LAB_001040e7;
  }
  sVar6 = 0;
  while (((uVar11 = (ulong)pbVar7[sVar6], uVar11 != 0 && (uVar11 != 0x3e)) &&
         ((puVar1[uVar11] & 0x2000) == 0))) {
    sVar6 = sVar6 + 1;
  }
  if (0x4f < (long)sVar6) goto LAB_00104117;
  memcpy(ptag,pbVar10 + 2,sVar6);
  ptag[sVar6] = '\0';
  if (local_210 == 1) {
    iVar4 = strcmp(couter,ptag);
    local_210 = 1;
    if (iVar4 == 0) {
      couter[0] = '\0';
      local_210 = 0;
      if (!bVar2) {
        bVar2 = true;
        local_208 = 0;
        goto LAB_001040e7;
      }
      goto LAB_00103ca3;
    }
  }
  else if (local_210 == 2) {
    iVar4 = strcmp(cmain,ptag);
    local_210 = 2;
    if (iVar4 == 0) {
      cmain[0] = '\0';
      local_210 = 1;
LAB_00103f95:
      if (!bVar2) {
        local_208 = 0;
        bVar2 = true;
        if ((local_204 != 0) && (iVar4 = decodedata(outbuf,outlen), iVar4 != 0)) {
          return -1;
        }
        goto LAB_001040e7;
      }
      goto LAB_00103ca3;
    }
  }
  else if (local_210 == 3) {
    iVar4 = strcmp(csub,ptag);
    local_210 = 3;
    if (iVar4 == 0) {
      csub[0] = '\0';
      local_210 = 2;
      goto LAB_00103f95;
    }
  }
joined_r0x00103d76:
  if (!bVar2) {
LAB_00103d7c:
    iVar4 = appenddata(outbuf,outlen,&outalloc,(char *)src_buf,local_204);
    if (iVar4 != 0) goto LAB_001040e5;
  }
  goto LAB_00103ca3;
code_r0x00103d56:
  pbVar7 = pbVar7 + 1;
  pbVar10 = __src;
  goto LAB_00103d3c;
}

Assistant:

int getpart(char **outbuf, size_t *outlen,
            const char *main, const char *sub, FILE *stream)
{
# define MAX_TAG_LEN 79
  char couter[MAX_TAG_LEN+1]; /* current outermost section */
  char cmain[MAX_TAG_LEN+1];  /* current main section */
  char csub[MAX_TAG_LEN+1];   /* current sub section */
  char ptag[MAX_TAG_LEN+1];   /* potential tag */
  char patt[MAX_TAG_LEN+1];   /* potential attributes */
  char *buffer = NULL;
  char *ptr;
  char *end;
  union {
    ssize_t sig;
     size_t uns;
  } len;
  size_t bufsize = 0;
  size_t outalloc = 256;
  int in_wanted_part = 0;
  int base64 = 0;
  int error;

  enum {
    STATE_OUTSIDE = 0,
    STATE_OUTER   = 1,
    STATE_INMAIN  = 2,
    STATE_INSUB   = 3,
    STATE_ILLEGAL = 4
  } state = STATE_OUTSIDE;

  *outlen = 0;
  *outbuf = malloc(outalloc);
  if(!*outbuf)
    return GPE_OUT_OF_MEMORY;
  *(*outbuf) = '\0';

  couter[0] = cmain[0] = csub[0] = ptag[0] = patt[0] = '\0';

  while((error = readline(&buffer, &bufsize, stream)) == GPE_OK) {

    ptr = buffer;
    EAT_SPACE(ptr);

    if('<' != *ptr) {
      if(in_wanted_part) {
        show(("=> %s", buffer));
        error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
        if(error)
          break;
      }
      continue;
    }

    ptr++;

    if('/' == *ptr) {
      /*
      ** closing section tag
      */

      ptr++;
      end = ptr;
      EAT_WORD(end);
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      if((STATE_INSUB == state) && !strcmp(csub, ptag)) {
        /* end of current sub section */
        state = STATE_INMAIN;
        csub[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_INMAIN == state) && !strcmp(cmain, ptag)) {
        /* end of current main section */
        state = STATE_OUTER;
        cmain[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_OUTER == state) && !strcmp(couter, ptag)) {
        /* end of outermost file section */
        state = STATE_OUTSIDE;
        couter[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }

    }
    else if(!in_wanted_part) {
      /*
      ** opening section tag
      */

      /* get potential tag */
      end = ptr;
      EAT_WORD(end);
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      /* ignore comments, doctypes and xml declarations */
      if(('!' == ptag[0]) || ('?' == ptag[0])) {
        show(("* ignoring (%s)", buffer));
        continue;
      }

      /* get all potential attributes */
      ptr = end;
      EAT_SPACE(ptr);
      end = ptr;
      while(*end && ('>' != *end))
        end++;
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(patt, ptr, len.uns);
      patt[len.uns] = '\0';

      if(STATE_OUTSIDE == state) {
        /* outermost element (<testcase>) */
        strcpy(couter, ptag);
        state = STATE_OUTER;
        continue;
      }
      else if(STATE_OUTER == state) {
        /* start of a main section */
        strcpy(cmain, ptag);
        state = STATE_INMAIN;
        continue;
      }
      else if(STATE_INMAIN == state) {
        /* start of a sub section */
        strcpy(csub, ptag);
        state = STATE_INSUB;
        if(!strcmp(cmain, main) && !strcmp(csub, sub)) {
          /* start of wanted part */
          in_wanted_part = 1;
          if(strstr(patt, "base64="))
              /* bit rough test, but "mostly" functional, */
              /* treat wanted part data as base64 encoded */
              base64 = 1;
        }
        continue;
      }

    }

    if(in_wanted_part) {
      show(("=> %s", buffer));
      error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
      if(error)
        break;
    }

  } /* while */

  free(buffer);

  if(error != GPE_OK) {
    if(error == GPE_END_OF_FILE)
      error = GPE_OK;
    else {
      free(*outbuf);
      *outbuf = NULL;
      *outlen = 0;
    }
  }

  return error;
}